

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

int __thiscall
CVmObjHTTPRequest::getp_getCookie
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  ushort *puVar4;
  void *pvVar5;
  char *len;
  undefined8 *puVar6;
  char cVar7;
  ulong uVar8;
  char *str;
  long lVar9;
  char *__s1;
  char *pcVar10;
  
  if (oargc == (uint *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = (long)(int)*oargc;
  }
  if (getp_getCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getCookie();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getCookie::desc);
  if (iVar3 == 0) {
    lVar2 = *(long *)(*(long *)(this->super_CVmObject).ext_ + 0x58);
    puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar4 == (ushort *)0x0) {
      err_throw(0x900);
    }
    retval->typ = VM_NIL;
    puVar6 = *(undefined8 **)(lVar2 + 0x10);
    if (puVar6 != (undefined8 *)0x0) {
      do {
        iVar3 = stricmp((char *)*puVar6,"cookie");
        if ((iVar3 == 0) && (*(char *)puVar6[1] != '\0')) {
          uVar1 = *puVar4;
          pcVar10 = (char *)puVar6[1];
LAB_00201de5:
          do {
            __s1 = pcVar10;
            cVar7 = *__s1;
            iVar3 = isspace((int)cVar7);
            pcVar10 = __s1 + 1;
          } while (iVar3 != 0);
          pcVar10 = __s1;
          if (cVar7 != '\0') {
            uVar8 = 0;
            do {
              str = pcVar10 + 1;
              pvVar5 = memchr("=;,",(int)cVar7,4);
              if (pvVar5 != (void *)0x0) {
                if (cVar7 != '=') goto LAB_00201e48;
                cVar7 = *str;
                pcVar10 = str;
                if (cVar7 != '\0') goto LAB_00201ec6;
                cVar7 = '\0';
                goto LAB_00201f00;
              }
              cVar7 = *str;
              uVar8 = uVar8 + 1;
              pcVar10 = str;
            } while (cVar7 != '\0');
          }
          uVar8 = (long)pcVar10 - (long)__s1;
          cVar7 = '\0';
LAB_00201e48:
          str = "";
          len = (char *)0x0;
          goto LAB_00201e51;
        }
LAB_00201dc1:
        puVar6 = (undefined8 *)puVar6[2];
      } while (puVar6 != (undefined8 *)0x0);
    }
LAB_00201f23:
    sp_ = sp_ + -lVar9;
  }
  return 1;
  while( true ) {
    cVar7 = pcVar10[1];
    pcVar10 = pcVar10 + 1;
    if (cVar7 == '\0') break;
LAB_00201ec6:
    pvVar5 = memchr(" \t;,",(int)cVar7,5);
    if (pvVar5 != (void *)0x0) goto LAB_00201f00;
  }
  cVar7 = '\0';
LAB_00201f00:
  len = pcVar10 + (~(ulong)__s1 - uVar8);
LAB_00201e51:
  if ((uVar8 == uVar1) && (iVar3 = bcmp(__s1,puVar4 + 1,(ulong)uVar1), iVar3 == 0)) {
    new_parsed_str(retval,str,(size_t)len,0);
    goto LAB_00201f23;
  }
  while( true ) {
    if (cVar7 == '\0') goto LAB_00201dc1;
    pvVar5 = memchr(" \t;,",(int)cVar7,5);
    if (pvVar5 == (void *)0x0) break;
    cVar7 = pcVar10[1];
    pcVar10 = pcVar10 + 1;
  }
  goto LAB_00201de5;
}

Assistant:

int CVmObjHTTPRequest::getp_getCookie(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* get the cookie name argument */
    const char *cname = G_stk->get(0)->get_as_string(vmg0_);
    if (cname == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* presume we won't find a match */
    retval->set_nil();

    /* scan for "Cookie" headers */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
    {
        /* if this is a Cookie: header, process it */
        if (stricmp(hdrs->name, "cookie") == 0)
        {
            /* scan the list of cookie name=value pairs */
            for (const char *p = hdrs->value ; *p != '\0' ; )
            {
                /* skip leading whitespace */
                for ( ; isspace(*p) ; ++p) ;

                /* the cookie name ends at the '=', ';', ',', or null */
                const char *name = p;
                for ( ; *p != '\0' && strchr("=;,", *p) == 0 ; ++p) ;
                size_t namelen = p - name;

                /* if we found the '=', scan the value */
                const char *val = "";
                size_t vallen = 0;
                if (*p == '=')
                {
                    /* skip the '=' and scan for the end of the cookie */
                    for (val = ++p ; *p != '\0' && strchr(" \t;,", *p) == 0 ;
                         ++p) ;
                    vallen = p - val;
                }

                /* if this matches the name we're looking for, return it */
                if (namelen == vmb_get_len(cname)
                    && memcmp(name, cname + VMB_LEN, namelen) == 0)
                {
                    /* it's a match - return the value as a string */
                    new_parsed_str(vmg_ retval, val, vallen, ENCMODE_NONE);

                    /* stop looking */
                    goto done;
                }
                
                /* scan ahead to the next non-delimiter */
                for ( ; *p != '\0' && strchr(" \t;,", *p) != 0 ; ++p) ;
            }
        }
    }

done:
    /* done with the arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}